

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

rcode __thiscall olc::PixelGameEngine::Start(PixelGameEngine *this)

{
  int iVar1;
  pointer pPVar2;
  PixelGameEngine *local_40;
  code *local_38;
  undefined8 local_30;
  thread local_28;
  thread t;
  PixelGameEngine *this_local;
  
  pPVar2 = std::unique_ptr<olc::Platform,_std::default_delete<olc::Platform>_>::operator->
                     ((unique_ptr<olc::Platform,_std::default_delete<olc::Platform>_> *)&platform);
  iVar1 = (*pPVar2->_vptr_Platform[2])();
  if (iVar1 == 1) {
    pPVar2 = std::unique_ptr<olc::Platform,_std::default_delete<olc::Platform>_>::operator->
                       ((unique_ptr<olc::Platform,_std::default_delete<olc::Platform>_> *)&platform)
    ;
    v2d_generic<int>::v2d_generic((v2d_generic<int> *)&t,0x1e,0x1e);
    iVar1 = (*pPVar2->_vptr_Platform[7])
                      (pPVar2,&t,&this->vWindowSize,(ulong)(this->bFullScreen & 1));
    if (iVar1 == 1) {
      olc_UpdateWindowSize(this,(this->vWindowSize).x,(this->vWindowSize).y);
      std::atomic<bool>::operator=((atomic<bool> *)&bAtomActive,true);
      local_38 = EngineThread;
      local_30 = 0;
      local_40 = this;
      std::thread::thread<void(olc::PixelGameEngine::*)(),olc::PixelGameEngine*,void>
                (&local_28,(type *)&local_38,&local_40);
      pPVar2 = std::unique_ptr<olc::Platform,_std::default_delete<olc::Platform>_>::operator->
                         ((unique_ptr<olc::Platform,_std::default_delete<olc::Platform>_> *)
                          &platform);
      (*pPVar2->_vptr_Platform[9])();
      std::thread::join();
      pPVar2 = std::unique_ptr<olc::Platform,_std::default_delete<olc::Platform>_>::operator->
                         ((unique_ptr<olc::Platform,_std::default_delete<olc::Platform>_> *)
                          &platform);
      iVar1 = (*pPVar2->_vptr_Platform[3])();
      this_local._4_4_ = (rcode)(iVar1 == 1);
      std::thread::~thread(&local_28);
    }
    else {
      this_local._4_4_ = FAIL;
    }
  }
  else {
    this_local._4_4_ = FAIL;
  }
  return this_local._4_4_;
}

Assistant:

olc::rcode PixelGameEngine::Start()
	{
		if (platform->ApplicationStartUp() != olc::OK)
			return olc::FAIL;

		// Construct the window
		if (platform->CreateWindowPane({30, 30}, vWindowSize, bFullScreen) != olc::OK)
			return olc::FAIL;
		olc_UpdateWindowSize(vWindowSize.x, vWindowSize.y);

		// Start the thread
		bAtomActive = true;
		std::thread t = std::thread(&PixelGameEngine::EngineThread, this);

		// Some implementations may form an event loop here
		platform->StartSystemEventLoop();

		// Wait for thread to be exited
		t.join();

		if (platform->ApplicationCleanUp() != olc::OK)
			return olc::FAIL;

		return olc::OK;
	}